

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_18::Inlining::run(Inlining *this,Module *module_)

{
  NameInfoMap *this_00;
  pointer *ppIVar1;
  char cVar2;
  uint uVar3;
  InliningMode IVar4;
  mapped_type mVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  Global *pGVar9;
  pointer puVar10;
  ElementSegment *pEVar11;
  pointer ppEVar12;
  pointer puVar13;
  DataSegment *pDVar14;
  pointer puVar15;
  Export *pEVar16;
  PassRunner *pPVar17;
  FunctionSplitter *pFVar18;
  __node_base_ptr p_Var19;
  Expression *pEVar20;
  __buckets_ptr pp_Var21;
  uintptr_t uVar22;
  pointer pIVar23;
  pointer pIVar24;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
  *p_Var25;
  IString name_00;
  string_view sVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  char *pcVar29;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
  *p_Var30;
  __node_base_ptr p_Var31;
  __node_base *p_Var32;
  size_type *psVar33;
  undefined3 uVar34;
  pointer pNVar35;
  __buckets_ptr pp_Var36;
  Expression *pEVar37;
  bool bVar38;
  Index IVar39;
  undefined4 uVar40;
  mapped_type *pmVar41;
  FunctionSplitter *pFVar42;
  Function *pFVar43;
  undefined7 extraout_var;
  Module *pMVar44;
  __node_ptr p_Var45;
  Module *pMVar46;
  undefined8 *puVar47;
  size_type sVar48;
  mapped_type *pmVar49;
  size_type sVar50;
  Expression *pEVar51;
  _Hash_node_base _Var52;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var53;
  undefined1 *puVar54;
  Unary *this_01;
  Call *pCVar55;
  Function *pFVar56;
  _Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
  *this_02;
  pointer pIVar57;
  pointer pIVar58;
  mapped_type *pmVar59;
  int iVar60;
  undefined1 auVar61 [8];
  undefined7 uVar64;
  Expression *pEVar62;
  long lVar63;
  pointer puVar65;
  Module *pMVar66;
  Module *pMVar67;
  __buckets_ptr __n;
  ulong uVar68;
  size_type __n_00;
  Type TVar69;
  char *__s_00;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar70;
  pointer puVar71;
  variant<wasm::Name,_wasm::HeapType> *__k;
  Module *pMVar72;
  Module *pMVar73;
  __node_base _Var74;
  ulong uVar75;
  uint uVar76;
  uint uVar77;
  pointer ppEVar78;
  Expression *pEVar79;
  __node_base_ptr p_Var80;
  Function *pFVar81;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  ulong uVar82;
  pointer puVar83;
  pointer puVar84;
  pointer puVar85;
  pointer pIVar86;
  undefined8 *puVar87;
  _Hash_node_base *p_Var88;
  pointer __ptr_1;
  pointer pIVar89;
  bool bVar90;
  Name target;
  Signature SVar91;
  undefined1 auVar92 [16];
  Signature sig;
  Iterator start_it;
  Iterator end_it;
  undefined1 local_418 [8];
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  iterationCounts;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  inlinedUses;
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  inlinedInto;
  undefined1 auStack_358 [8];
  Name name;
  __buckets_alloc_type __alloc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  pointer puStack_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  _Stack_318;
  undefined1 local_2f8;
  undefined1 local_2f0 [192];
  pointer local_230;
  undefined8 local_220;
  _Alloc_hider _Stack_218;
  undefined1 *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 auStack_1e8 [8];
  Name inlinedName;
  __node_base local_1c8;
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined1 local_1b8 [8];
  Function *inlinedFunction;
  undefined **local_1a8;
  Module *local_1a0;
  Function *func_2;
  Module *local_190;
  pointer pNStack_188;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcNames;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 auStack_148 [8];
  ChosenActions chosenActions;
  unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_> local_100;
  undefined1 auStack_f8 [8];
  InliningState state;
  pointer __ptr_3;
  Builder builder;
  undefined8 local_60;
  
  this->module = module_;
  puVar6 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar7 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_418 = (undefined1  [8])&iterationCounts._M_h._M_rehash_policy._M_next_resize;
  iterationCounts._M_h._M_buckets = (__buckets_ptr)0x1;
  iterationCounts._M_h._M_bucket_count = 0;
  iterationCounts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  iterationCounts._M_h._M_element_count._0_4_ = 0x3f800000;
  iterationCounts._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  iterationCounts._M_h._M_rehash_policy._4_4_ = 0;
  iterationCounts._M_h._M_rehash_policy._M_next_resize = 0;
  this_00 = &this->infos;
  inlinedFunction = (Function *)(local_2f0 + 0xb0);
  local_1a8 = &PTR__Pass_010909c0;
  uVar82 = 0;
  do {
    if ((ulong)((long)puVar6 - (long)puVar7 >> 3) < uVar82) break;
    inlinedUses._M_h._M_single_bucket =
         (__node_base_ptr)&inlinedInto._M_h._M_rehash_policy._M_next_resize;
    inlinedInto._M_h._M_buckets = (__buckets_ptr)0x1;
    inlinedInto._M_h._M_bucket_count = 0;
    inlinedInto._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    inlinedInto._M_h._M_element_count._0_4_ = 0x3f800000;
    inlinedInto._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    inlinedInto._M_h._M_rehash_policy._4_4_ = 0;
    inlinedInto._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&this_00->_M_h);
    puVar65 = (this->module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar71 = (this->module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar81 = inlinedFunction,
        puVar71 != puVar65; puVar71 = puVar71 + 1) {
      std::
      unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
      ::operator[](this_00,(key_type *)
                           (puVar71->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    }
    local_338 = &local_328;
    puStack_330 = (pointer)0x0;
    local_328._M_allocated_capacity._0_4_ = local_328._M_allocated_capacity._0_4_ & 0xffffff00;
    local_2f8 = 0;
    local_2f0._0_8_ = (pointer)0x0;
    local_2f0._8_8_ = (pointer)0x0;
    (inlinedFunction->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    *(undefined8 *)&(pFVar81->super_Importable).super_Named.hasExplicitName = 0;
    (pFVar81->super_Importable).module.super_IString.str._M_len = 0;
    (pFVar81->super_Importable).super_Named.name.super_IString.str._M_len = 0;
    (pFVar81->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
    name.super_IString.str._M_str = (char *)&PTR__WalkerPass_01092ca0;
    pMVar73 = (Module *)(this->super_Pass).runner;
    _Stack_218._M_p = (pointer)this_00;
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
           *)&name.super_IString.str._M_str,this->module);
    pMVar72 = this->module;
    puVar8 = (pMVar72->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_220 = pMVar72;
    for (puVar83 = (pMVar72->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar83 != puVar8;
        puVar83 = puVar83 + 1) {
      pGVar9 = (puVar83->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar9->super_Importable).module + 8) == (char *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)local_2f0,&pGVar9->init);
      }
    }
    puVar10 = (pMVar72->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar84 = (pMVar72->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar84 != puVar10;
        puVar84 = puVar84 + 1) {
      pEVar11 = (puVar84->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (pEVar11->offset != (Expression *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)local_2f0,&pEVar11->offset);
      }
      pEVar11 = (puVar84->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      ppEVar12 = *(pointer *)
                  ((long)&(pEVar11->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                  + 8);
      for (ppEVar78 = *(pointer *)
                       &(pEVar11->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl; ppEVar78 != ppEVar12; ppEVar78 = ppEVar78 + 1) {
        auStack_f8 = (undefined1  [8])*ppEVar78;
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)local_2f0,(Expression **)auStack_f8);
      }
    }
    puVar13 = (pMVar72->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar85 = (pMVar72->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar85 != puVar13;
        puVar85 = puVar85 + 1) {
      pDVar14 = (puVar85->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar14->offset != (Expression *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)local_2f0,&pDVar14->offset);
      }
    }
    local_220 = (Module *)0x0;
    if ((pointer)local_2f0._176_8_ != (pointer)0x0) {
      operator_delete((void *)local_2f0._176_8_,(long)local_230 - local_2f0._176_8_);
    }
    Pass::~Pass((Pass *)&name.super_IString.str._M_str);
    puVar15 = (this->module->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar70 = (this->module->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar70 != puVar15;
        puVar70 = puVar70 + 1) {
      pEVar16 = (puVar70->_M_t).
                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar16->kind == Function) {
        if (*(__index_type *)
             ((long)&(pEVar16->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) ==
            '\0') {
          __k = &pEVar16->value;
        }
        else {
          __k = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        pmVar41 = std::
                  unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                  ::operator[](this_00,(key_type *)__k);
        pmVar41->usedGlobally = true;
      }
    }
    pMVar72 = this->module;
    if ((pMVar72->start).super_IString.str._M_str != (char *)0x0) {
      pMVar72 = (Module *)&pMVar72->start;
      pmVar41 = std::
                unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                ::operator[](this_00,(key_type *)pMVar72);
      pmVar41->usedGlobally = true;
    }
    pPVar17 = (this->super_Pass).runner;
    if (((2 < (pPVar17->options).optimizeLevel) && ((pPVar17->options).shrinkLevel == 0)) &&
       ((pPVar17->options).inlining.partialInliningIfs != 0)) {
      pFVar42 = (FunctionSplitter *)operator_new(0x48);
      pFVar42->module = this->module;
      pFVar42->options = &pPVar17->options;
      (pFVar42->splits)._M_h._M_buckets = (__node_base_ptr *)((long)&(pFVar42->splits)._M_h + 0x30);
      *(size_type *)((long)&(pFVar42->splits)._M_h + 8) = 1;
      ((__node_base *)((long)&(pFVar42->splits)._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
      *(size_type *)((long)&(pFVar42->splits)._M_h + 0x18) = 0;
      ((_Prime_rehash_policy *)((long)&(pFVar42->splits)._M_h + 0x20))->_M_max_load_factor = 1.0;
      *(size_t *)((long)&(pFVar42->splits)._M_h + 0x28) = 0;
      *(__node_base_ptr *)((long)&(pFVar42->splits)._M_h + 0x30) = (__node_base_ptr)0x0;
      pFVar18 = (this->functionSplitter)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                _M_head_impl;
      (this->functionSplitter)._M_t.
      super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>._M_head_impl =
           pFVar42;
      if (pFVar18 != (FunctionSplitter *)0x0) {
        std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>::operator()
                  ((default_delete<wasm::(anonymous_namespace)::FunctionSplitter> *)pFVar18,
                   (FunctionSplitter *)pMVar72);
      }
    }
    auStack_f8 = (undefined1  [8])&state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize;
    state.inlinableFunctions._M_h._M_buckets = (__buckets_ptr)0x1;
    state.inlinableFunctions._M_h._M_bucket_count = 0;
    state.inlinableFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    pMVar72 = (Module *)0x3f800000;
    state.inlinableFunctions._M_h._M_element_count._0_4_ = 0x3f800000;
    state.inlinableFunctions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.inlinableFunctions._M_h._M_rehash_policy._4_4_ = 0;
    state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize = 0;
    auVar61 = (undefined1  [8])&state.actionsForFunction._M_h._M_rehash_policy._M_next_resize;
    state.actionsForFunction._M_h._M_buckets = (__buckets_ptr)0x1;
    state.actionsForFunction._M_h._M_bucket_count = 0;
    state.actionsForFunction._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    state.actionsForFunction._M_h._M_element_count._0_4_ = 0x3f800000;
    state.actionsForFunction._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.actionsForFunction._M_h._M_rehash_policy._4_4_ = 0;
    state.actionsForFunction._M_h._M_rehash_policy._M_next_resize = 0;
    pFVar81 = (Function *)
              (this->module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    func_2 = (Function *)
             (this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    state.inlinableFunctions._M_h._M_single_bucket = (__node_base_ptr)auVar61;
    if (pFVar81 != func_2) {
      do {
        pFVar56 = (Function *)(pFVar81->super_Importable).super_Named.name.super_IString.str._M_len;
        if (*(char **)((long)&(pFVar56->super_Importable).module + 8) == (char *)0x0) {
          pMVar44 = *(Module **)&(pFVar56->super_Importable).super_Named;
          chosenActions._M_h._M_buckets =
               *(__buckets_ptr *)((long)&(pFVar56->super_Importable).super_Named + 8);
          name_00.str = *(string_view *)&(pFVar56->super_Importable).super_Named;
          auStack_148 = (undefined1  [8])pMVar44;
          pFVar43 = Module::getFunction(this->module,
                                        (Name)*(string_view *)
                                               &(pFVar56->super_Importable).super_Named);
          pMVar72 = (Module *)
                    std::
                    unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                    ::operator[](this_00,(key_type *)auStack_148);
          iVar60 = *(int *)&(((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                               *)&pMVar72->exports)->
                            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            ).stack.fixed._M_elems[0].func;
          if (iVar60 == 0) {
            if (pFVar43->noFullInline == false) {
              bVar38 = FunctionInfo::worthFullInlining
                                 ((FunctionInfo *)pMVar72,&((this->super_Pass).runner)->options);
              iVar60 = 2;
              if (!bVar38) goto LAB_008eb6e3;
            }
            else {
LAB_008eb6e3:
              iVar60 = 1;
              if (pFVar43->noPartialInline == false) {
                pFVar18 = (this->functionSplitter)._M_t.
                          super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                          .
                          super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>
                          ._M_head_impl;
                if (pFVar18 != (FunctionSplitter *)0x0) {
                  pFVar43 = Module::getFunction(this->module,(Name)name_00.str);
                  uVar3 = (pFVar18->options->inlining).partialInliningIfs;
                  if (uVar3 == 0) {
                    __assert_fail("MaxIfs > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                  ,0x335,
                                  "InliningMode wasm::(anonymous namespace)::FunctionSplitter::getSplitDrivenInliningMode(Function *, FunctionInfo &)"
                                 );
                  }
                  pMVar67 = (Module *)pFVar43->body;
                  if ((*(char *)&pMVar67->exports != '\x01') ||
                     (target.super_IString.str._M_str = (char *)auVar61,
                     target.super_IString.str._M_len =
                          (size_t)*(Expression ***)
                                   &(pMVar67->functions).
                                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                    ._M_impl,
                     bVar38 = BranchUtils::BranchSeeker::has
                                        ((BranchSeeker *)pMVar67,
                                         (Expression *)
                                         ((array<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_10UL>
                                           *)((long)&pMVar67->exports + 0x10))->_M_elems[0].func,
                                         target), pMVar44 = pMVar72, !bVar38)) {
                    auVar61 = (undefined1  [8])pMVar67;
                    if ((*(char *)&pMVar67->exports == '\x01') &&
                       (*(pointer *)((long)&pMVar67->functions + 0x10) != (pointer)0x0)) {
                      auVar61 = *(undefined1 (*) [8])((Task *)((long)&pMVar67->functions + 8))->func
                      ;
                    }
                    if (auVar61 == (undefined1  [8])0x0) {
                      auVar61 = (undefined1  [8])0x0;
                    }
                    else if (*(char *)&(((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                          *)&((Module *)auVar61)->exports)->
                                       super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                       ).replacep != '\x02') {
                      auVar61 = (undefined1  [8])0x0;
                    }
                    if ((auVar61 == (undefined1  [8])0x0) ||
                       (builder.wasm = (Module *)auVar61,
                       bVar38 = FunctionSplitter::isSimple
                                          ((FunctionSplitter *)
                                           ((array<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_10UL>
                                             *)((long)&((Module *)auVar61)->exports + 0x10))->
                                           _M_elems[0].func,(Expression *)pMVar44), !bVar38)) {
LAB_008eba5f:
                      iVar60 = 1;
                    }
                    else if ((((builder.wasm)->functions).
                              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) &&
                            ((SVar91 = HeapType::getSignature(&pFVar43->type),
                             auVar61 = (undefined1  [8])pMVar72, SVar91.results.id.id == 0 &&
                             (*(char *)&((((builder.wasm)->functions).
                                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                        ._M_t == '\x13')))) {
                      if (*(char *)&pMVar67->exports != '\x01') {
                        __assert_fail("body->is<Block>()",
                                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                      ,0x358,
                                      "InliningMode wasm::(anonymous namespace)::FunctionSplitter::getSplitDrivenInliningMode(Function *, FunctionInfo &)"
                                     );
                      }
                      iVar60 = *(int *)((long)&(((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                                  *)&pMVar72->exports)->
                                               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                               ).replacep + 4);
                      IVar39 = Measurer::measure((Expression *)builder.wasm);
                      if (pFVar43->noFullInline == false) {
                        bVar38 = FunctionSplitter::outlinedFunctionWorthInlining
                                           (pFVar18,(FunctionInfo *)pMVar72,iVar60 - IVar39);
                        iVar60 = 2;
                        if (bVar38) goto LAB_008eba63;
                      }
                      iVar60 = 3;
                    }
                    else {
                      cVar2 = *(char *)&pMVar67->exports;
                      uVar77 = 0;
                      do {
                        uVar76 = uVar77;
                        pMVar44 = (Module *)(ulong)uVar76;
                        if (cVar2 == '\x01') {
                          pMVar46 = *(Module **)((long)&pMVar67->functions + 0x10);
                          bVar38 = pMVar44 < pMVar46;
                          if (pMVar44 < pMVar46) {
                            auVar61 = *(undefined1 (*) [8])
                                       ((long)((Task *)((long)&pMVar67->functions + 8))->func +
                                       (long)pMVar44 * 8);
                            bVar38 = true;
                          }
                        }
                        else {
                          bVar38 = false;
                        }
                        bVar90 = false;
                        pMVar46 = (Module *)0x0;
                        if (uVar76 == 0) {
                          pMVar46 = pMVar67;
                        }
                        if (bVar38) {
                          pMVar46 = (Module *)auVar61;
                        }
                        if (pMVar46 != (Module *)0x0) {
                          bVar90 = *(char *)&(((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                                *)&pMVar46->exports)->
                                             super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                             ).replacep == '\x02';
                        }
                        uVar77 = uVar76 + 1;
                      } while ((uVar76 <= uVar3) && (bVar90));
                      if (uVar3 <= uVar76 - 1) goto LAB_008eb8c3;
                      if ((cVar2 == '\x01') &&
                         (auVar61 = (undefined1  [8])pMVar67,
                         (pointer)(ulong)uVar76 < *(pointer *)((long)&pMVar67->functions + 0x10))) {
                        auVar61 = (undefined1  [8])((Task *)((long)&pMVar67->functions + 8))->func;
                        pFVar42 = *(FunctionSplitter **)
                                   ((long)((((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                              *)&((Module *)auVar61)->exports)->
                                           super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                           ).stack.fixed._M_elems + -1) + (long)(ulong)uVar76 * 8);
                      }
                      else {
                        pFVar42 = (FunctionSplitter *)0x0;
                      }
                      if (pFVar42 != (FunctionSplitter *)0x0) {
                        bVar38 = FunctionSplitter::isSimple(pFVar42,(Expression *)pMVar72);
                        pMVar46 = (Module *)CONCAT71(extraout_var,bVar38);
                        if (!bVar38) goto LAB_008eba5f;
                        if (cVar2 == '\x01') {
                          puVar65 = (pointer)(ulong)uVar77;
                          puVar71 = *(pointer *)((long)&pMVar67->functions + 0x10);
                          uVar64 = (undefined7)((ulong)auVar61 >> 8);
                          auVar61 = (undefined1  [8])CONCAT71(uVar64,puVar65 < puVar71);
                          if (puVar65 < puVar71) {
                            pMVar46 = *(Module **)
                                       ((long)((Task *)((long)&pMVar67->functions + 8))->func +
                                       (long)puVar65 * 8);
                            auVar61 = (undefined1  [8])CONCAT71(uVar64,1);
                          }
                        }
                        else {
                          auVar61 = (undefined1  [8])0x0;
                        }
                        pMVar66 = (Module *)0x0;
                        if (uVar77 == 0) {
                          pMVar66 = pMVar67;
                        }
                        if (SUB81(auVar61,0) != '\0') {
                          pMVar66 = pMVar46;
                        }
                        iVar60 = 1;
                        if (pMVar66 != (Module *)0x0) goto LAB_008eba63;
                      }
                      if (uVar76 != 0) {
                        p_Var80 = (__node_base_ptr)0x0;
                        state.actionsForFunction._M_h._M_single_bucket = (__node_base_ptr)pMVar44;
                        do {
                          if (*(char *)&pMVar67->exports == '\x01') {
                            p_Var19 = *(__node_base_ptr *)((long)&pMVar67->functions + 0x10);
                            uVar64 = (undefined7)((ulong)auVar61 >> 8);
                            auVar61 = (undefined1  [8])CONCAT71(uVar64,p_Var80 < p_Var19);
                            if (p_Var80 < p_Var19) {
                              pMVar44 = *(Module **)
                                         ((long)((Task *)((long)&pMVar67->functions + 8))->func +
                                         (long)p_Var80 * 8);
                              auVar61 = (undefined1  [8])CONCAT71(uVar64,1);
                            }
                          }
                          else {
                            auVar61 = (undefined1  [8])0x0;
                          }
                          pMVar46 = (Module *)0x0;
                          if (p_Var80 == (__node_base_ptr)0x0) {
                            pMVar46 = pMVar67;
                          }
                          if (SUB81(auVar61,0) != '\0') {
                            pMVar46 = pMVar44;
                          }
                          if (*(char *)&(((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                           *)&pMVar46->exports)->
                                        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                        ).replacep != '\x02') {
                            pMVar46 = (Module *)0x0;
                          }
                          bVar38 = FunctionSplitter::isSimple
                                             ((FunctionSplitter *)
                                              (((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                                 *)&pMVar46->exports)->
                                              super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                              ).stack.fixed._M_elems[0].func,(Expression *)pMVar72);
                          if ((!bVar38) ||
                             ((pMVar46->functions).
                              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0))
                          goto LAB_008eba5f;
                          pEVar62 = (Expression *)
                                    (pMVar46->functions).
                                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pMVar44 = (Module *)(pEVar62->type).id;
                          if (pMVar44 != (Module *)0x1) {
                            if (pMVar44 != (Module *)0x0) {
                              __assert_fail("iff->ifTrue->type == Type::unreachable",
                                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                            ,0x3ad,
                                            "InliningMode wasm::(anonymous namespace)::FunctionSplitter::getSplitDrivenInliningMode(Function *, FunctionInfo &)"
                                           );
                            }
                            FindAll<wasm::Return>::FindAll
                                      ((FindAll<wasm::Return> *)&name.super_IString.str._M_str,
                                       pEVar62);
                            pcVar29 = name.super_IString.str._M_str;
                            pMVar44 = pMVar73;
                            if (name.super_IString.str._M_str != (char *)0x0) {
                              local_190 = pMVar73;
                              operator_delete(name.super_IString.str._M_str,
                                              (long)local_338 - (long)name.super_IString.str._M_str)
                              ;
                              pMVar44 = local_190;
                            }
                            if ((Module *)pcVar29 != pMVar44) goto LAB_008eba5f;
                          }
                          p_Var80 = (__node_base_ptr)((long)&p_Var80->_M_nxt + 1);
                        } while (state.actionsForFunction._M_h._M_single_bucket != p_Var80);
                        if (uVar77 == 2) {
                          IVar39 = Measurer::measure((Expression *)
                                                     ((builder.wasm)->functions).
                                                                                                          
                                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          if ((pFVar43->noFullInline == false) &&
                             (bVar38 = FunctionSplitter::outlinedFunctionWorthInlining
                                                 (pFVar18,(FunctionInfo *)pMVar72,IVar39), bVar38))
                          {
                            auVar61 = (undefined1  [8])0x2;
                            bVar38 = false;
                          }
                          else {
                            auVar61 = (undefined1  [8])0x1;
                            bVar38 = true;
                          }
                          iVar60 = SUB84(auVar61,0);
                          if (!bVar38) goto LAB_008eba63;
                        }
                      }
                      iVar60 = 4;
                    }
                    goto LAB_008eba63;
                  }
                }
LAB_008eb8c3:
                iVar60 = 1;
              }
            }
LAB_008eba63:
            *(int *)&(((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                        *)&pMVar72->exports)->
                     super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     ).stack.fixed._M_elems[0].func = iVar60;
          }
          if (iVar60 != 1) {
            if (iVar60 == 0) {
              __assert_fail("inliningMode != InliningMode::Unknown",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                            ,0x50f,
                            "auto wasm::(anonymous namespace)::Inlining::iteration(std::unordered_set<Function *> &)::(anonymous class)::operator()(Function *) const"
                           );
            }
            pMVar44 = *(Module **)((long)&(pFVar56->super_Importable).super_Named + 8);
            pMVar67 = (Module *)((ulong)pMVar44 % (ulong)state.inlinableFunctions._M_h._M_buckets);
            auVar61 = (undefined1  [8])pMVar44;
            pMVar72 = pMVar67;
            p_Var45 = std::
                      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::_M_find_node((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                      *)auStack_f8,(size_type)pMVar67,(key_type *)pFVar56,
                                     (__hash_code)pMVar44);
            if (p_Var45 == (__node_ptr)0x0) {
              p_Var45 = (__node_ptr)operator_new(0x28);
              (p_Var45->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
              pcVar29 = *(char **)((long)&(pFVar56->super_Importable).super_Named + 8);
              (p_Var45->
              super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
              ).
              super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
              ._M_storage._M_storage.__align =
                   *(anon_struct_8_0_00000001_for___align *)&(pFVar56->super_Importable).super_Named
              ;
              *(char **)((long)&(p_Var45->
                                super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                                ._M_storage._M_storage + 8) = pcVar29;
              *(undefined4 *)
               ((long)&(p_Var45->
                       super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                       ._M_storage._M_storage + 0x10) = 0;
              pMVar72 = (Module *)state.inlinableFunctions._M_h._M_buckets;
              auVar92 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                  ((ulong)&state.inlinableFunctions._M_h._M_element_count,
                                   (ulong)state.inlinableFunctions._M_h._M_buckets,
                                   (ulong)state.inlinableFunctions._M_h._M_before_begin._M_nxt);
              __n = auVar92._8_8_;
              if ((auVar92 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                if (__n == (__buckets_ptr)0x1) {
                  state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize = 0;
                  pMVar46 = (Module *)&state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize
                  ;
                }
                else {
                  pMVar46 = (Module *)
                            __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                      ((new_allocator<std::__detail::_Hash_node_base_*> *)
                                       &name.super_IString.str._M_str,(size_type)__n,(void *)0x0);
                  pMVar72 = (Module *)0x0;
                  memset(pMVar46,0,(long)__n * 8);
                }
                pMVar67 = (Module *)state.inlinableFunctions._M_h._M_bucket_count;
                state.inlinableFunctions._M_h._M_bucket_count = 0;
                if (pMVar67 != (Module *)0x0) {
                  uVar75 = 0;
                  do {
                    pMVar72 = (Module *)
                              (((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                 *)&pMVar67->exports)->
                              super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                              ).replacep;
                    uVar68 = (ulong)(pMVar67->functions).
                                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish % (ulong)__n;
                    puVar47 = *(undefined8 **)
                               ((long)((((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                          *)&pMVar46->exports)->
                                       super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                       ).stack.fixed._M_elems + -1) + uVar68 * 8);
                    if (puVar47 == (undefined8 *)0x0) {
                      (((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                         *)&pMVar67->exports)->
                      super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      ).replacep = (Expression **)state.inlinableFunctions._M_h._M_bucket_count;
                      state.inlinableFunctions._M_h._M_bucket_count = (size_type)pMVar67;
                      *(size_type **)
                       ((long)((((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                  *)&pMVar46->exports)->
                               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                               ).stack.fixed._M_elems + -1) + uVar68 * 8) =
                           &state.inlinableFunctions._M_h._M_bucket_count;
                      if ((((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                             *)&pMVar67->exports)->
                          super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                          ).replacep != (Expression **)0x0) {
                        puVar47 = (undefined8 *)
                                  ((long)((((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                             *)&pMVar46->exports)->
                                          super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                          ).stack.fixed._M_elems + -1) + uVar75 * 8);
                        goto LAB_008ebba7;
                      }
                    }
                    else {
                      (((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                         *)&pMVar67->exports)->
                      super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      ).replacep = (Expression **)*puVar47;
                      puVar47 = *(undefined8 **)
                                 ((long)((((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                            *)&pMVar46->exports)->
                                         super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                         ).stack.fixed._M_elems + -1) + uVar68 * 8);
                      uVar68 = uVar75;
LAB_008ebba7:
                      *puVar47 = pMVar67;
                    }
                    pMVar67 = pMVar72;
                    uVar75 = uVar68;
                  } while (pMVar72 != (Module *)0x0);
                }
                if ((undefined1  [8])&state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize
                    != auStack_f8) {
                  pMVar72 = (Module *)((long)state.inlinableFunctions._M_h._M_buckets << 3);
                  operator_delete((void *)auStack_f8,(ulong)pMVar72);
                }
                pMVar67 = (Module *)((ulong)pMVar44 % (ulong)__n);
                auStack_f8 = (undefined1  [8])pMVar46;
                state.inlinableFunctions._M_h._M_buckets = __n;
              }
              (p_Var45->
              super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
              ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)pMVar44;
              puVar47 = *(undefined8 **)((long)auStack_f8 + (long)pMVar67 * 8);
              if (puVar47 == (undefined8 *)0x0) {
                (p_Var45->super__Hash_node_base)._M_nxt =
                     (_Hash_node_base *)state.inlinableFunctions._M_h._M_bucket_count;
                if (state.inlinableFunctions._M_h._M_bucket_count != 0) {
                  *(__node_ptr *)
                   ((long)auStack_f8 +
                   (*(ulong *)(state.inlinableFunctions._M_h._M_bucket_count + 0x20) %
                   (ulong)state.inlinableFunctions._M_h._M_buckets) * 8) = p_Var45;
                }
                auVar61 = (undefined1  [8])&state.inlinableFunctions._M_h._M_bucket_count;
                *(undefined1 (*) [8])((long)auStack_f8 + (long)pMVar67 * 8) = auVar61;
                state.inlinableFunctions._M_h._M_bucket_count = (size_type)p_Var45;
              }
              else {
                (p_Var45->super__Hash_node_base)._M_nxt = (_Hash_node_base *)*puVar47;
                **(undefined8 **)((long)auStack_f8 + (long)pMVar67 * 8) = p_Var45;
                auVar61 = auStack_f8;
              }
              state.inlinableFunctions._M_h._M_before_begin._M_nxt =
                   (_Hash_node_base *)
                   ((long)&(state.inlinableFunctions._M_h._M_before_begin._M_nxt)->_M_nxt + 1);
            }
            *(int *)((long)&(p_Var45->
                            super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                            ._M_storage._M_storage + 0x10) = iVar60;
          }
        }
        pFVar81 = (Function *)&(pFVar81->super_Importable).super_Named.name.super_IString.str._M_str
        ;
      } while (pFVar81 != func_2);
    }
    p_Var30 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
               *)state.actionsForFunction._M_h._M_bucket_count;
    if (state.inlinableFunctions._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      pNStack_188 = (pointer)0x0;
      funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar65 = (this->module->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar71 = (this->module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pFVar81 = inlinedFunction,
          puVar71 != puVar65; puVar71 = puVar71 + 1) {
        std::
        unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
        ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                      *)&state.inlinableFunctions._M_h._M_single_bucket,
                     (key_type *)
                     (puVar71->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        pFVar81 = (puVar71->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start ==
            funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)&pNStack_188,
                     (iterator)
                     funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start,(Name *)pFVar81);
        }
        else {
          pcVar29 = *(char **)((long)&(pFVar81->super_Importable).super_Named + 8);
          ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_len =
               *(size_t *)&(pFVar81->super_Importable).super_Named;
          ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar29;
          funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      local_338 = &local_328;
      puStack_330 = (pointer)0x0;
      local_328._M_allocated_capacity._0_4_ = local_328._M_allocated_capacity._0_4_ & 0xffffff00;
      local_2f8 = 0;
      local_2f0._0_8_ = (pointer)0x0;
      local_2f0._8_8_ = (pointer)0x0;
      (inlinedFunction->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      (pFVar81->super_Importable).base.super_IString.str._M_len = 0;
      *(undefined8 *)&(pFVar81->super_Importable).super_Named.hasExplicitName = 0;
      (pFVar81->super_Importable).module.super_IString.str._M_len = 0;
      (pFVar81->super_Importable).super_Named.name.super_IString.str._M_len = 0;
      (pFVar81->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
      name.super_IString.str._M_str = (char *)&PTR__WalkerPass_01092d00;
      local_210 = auStack_f8;
      pMVar73 = this->module;
      WalkerPass<wasm::TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
      ::run((WalkerPass<wasm::TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
             *)&name.super_IString.str._M_str,pMVar73);
      if ((pointer)local_2f0._176_8_ != (pointer)0x0) {
        pMVar73 = (Module *)((long)local_230 - local_2f0._176_8_);
        operator_delete((void *)local_2f0._176_8_,(ulong)pMVar73);
      }
      Pass::~Pass((Pass *)&name.super_IString.str._M_str);
      pNVar35 = funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start;
      auStack_148 = (undefined1  [8])&chosenActions._M_h._M_rehash_policy._M_next_resize;
      chosenActions._M_h._M_buckets = (__buckets_ptr)0x1;
      chosenActions._M_h._M_bucket_count = 0;
      chosenActions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      chosenActions._M_h._M_element_count._0_4_ = 0x3f800000;
      chosenActions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      chosenActions._M_h._M_rehash_policy._4_4_ = 0;
      chosenActions._M_h._M_rehash_policy._M_next_resize = 0;
      iterationCounts._M_h._M_single_bucket =
           (__node_base_ptr)&inlinedUses._M_h._M_rehash_policy._M_next_resize;
      inlinedUses._M_h._M_buckets = (__buckets_ptr)0x1;
      inlinedUses._M_h._M_bucket_count = 0;
      inlinedUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      inlinedUses._M_h._M_element_count._0_4_ = 0x3f800000;
      inlinedUses._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      inlinedUses._M_h._M_rehash_policy._4_4_ = 0;
      inlinedUses._M_h._M_rehash_policy._M_next_resize = 0;
      p_Var31 = inlinedInto._M_h._M_single_bucket;
      for (inlinedInto._M_h._M_single_bucket = (__node_base_ptr)pNStack_188;
          (pointer)inlinedInto._M_h._M_single_bucket != pNVar35;
          inlinedInto._M_h._M_single_bucket =
               (__node_base_ptr)(inlinedInto._M_h._M_single_bucket + 2)) {
        auStack_358 = (undefined1  [8])
                      (((pointer)inlinedInto._M_h._M_single_bucket)->super_IString).str._M_len;
        name.super_IString.str._M_len =
             (size_t)(((pointer)inlinedInto._M_h._M_single_bucket)->super_IString).str._M_str;
        pMVar73 = (Module *)
                  Module::getFunction(this->module,
                                      (Name)(((pointer)inlinedInto._M_h._M_single_bucket)->
                                            super_IString).str);
        local_1a0 = pMVar73;
        sVar48 = std::
                 _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::count((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&iterationCounts._M_h._M_single_bucket,(key_type *)pMVar73);
        if (sVar48 == 0) {
          pMVar73 = (Module *)auStack_358;
          pmVar49 = std::
                    unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                    ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                                  *)&state.inlinableFunctions._M_h._M_single_bucket,
                                 (key_type *)pMVar73);
          pFVar81 = (Function *)
                    (pmVar49->
                    super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          func_2 = (Function *)
                   (pmVar49->
                   super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pFVar81 != func_2) {
            do {
              local_1b8 = (undefined1  [8])
                          (pFVar81->super_Importable).super_Named.name.super_IString.str._M_str;
              pMVar73 = (Module *)local_1b8;
              sVar50 = std::
                       _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)&inlinedUses._M_h._M_single_bucket,(key_type *)pMVar73);
              if (sVar50 == 0) {
                auStack_1e8 = (undefined1  [8])
                              (((Importable *)local_1b8)->super_Named).name.super_IString.str._M_len
                ;
                inlinedName.super_IString.str._M_len = *(size_t *)((long)local_1b8 + 8);
                name.super_IString.str._M_str =
                     (char *)(local_1a0->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                local_168._0_8_ = auStack_1e8;
                local_168._8_8_ = inlinedName.super_IString.str._M_len;
                pmVar41 = std::
                          unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                          ::operator[](this_00,(key_type *)&name.super_IString.str._M_str);
                IVar39 = pmVar41->size;
                pMVar73 = (Module *)local_168;
                pmVar41 = std::
                          unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                          ::operator[](this_00,(key_type *)pMVar73);
                if ((double)(IVar39 + pmVar41->size) * 2.5 < 409600.0) {
                  pFVar56 = (Function *)
                            (pFVar81->super_Importable).super_Named.name.super_IString.str._M_str;
                  pmVar41 = std::
                            unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                            ::operator[](this_00,(key_type *)pFVar56);
                  IVar4 = pmVar41->inliningMode;
                  if (IVar4 != Full) {
                    pFVar18 = (this->functionSplitter)._M_t.
                              super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                              .
                              super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>
                              ._M_head_impl;
                    if (pFVar18 == (FunctionSplitter *)0x0) {
                      __assert_fail("functionSplitter",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                    ,0x5a3,
                                    "Function *wasm::(anonymous namespace)::Inlining::getActuallyInlinedFunction(Function *)"
                                   );
                    }
                    if (1 < IVar4 - SplitPatternA) {
                      __assert_fail("inliningMode == InliningMode::SplitPatternA || inliningMode == InliningMode::SplitPatternB"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                    ,0x3c9,
                                    "Function *wasm::(anonymous namespace)::FunctionSplitter::getInlineableSplitFunction(Function *, InliningMode)"
                                   );
                    }
                    pEVar79 = (Expression *)
                              (pFVar56->super_Importable).super_Named.name.super_IString.str._M_str;
                    uVar75 = *(size_type *)((long)&(pFVar18->splits)._M_h + 8);
                    uVar68 = (ulong)pEVar79 % uVar75;
                    pEVar62 = (Expression *)(pFVar18->splits)._M_h._M_buckets[uVar68];
                    pEVar51 = (Expression *)0x0;
                    if (pEVar62 != (Expression *)0x0) {
                      pEVar37 = pEVar62;
                      _Var74._M_nxt = *(_Hash_node_base **)pEVar62;
                      pEVar20 = (Expression *)(*(_Hash_node_base **)pEVar62)[5]._M_nxt;
                      do {
                        pEVar51 = pEVar37;
                        if ((pEVar20 == pEVar79) &&
                           (pEVar79 ==
                            (Expression *)*(_Hash_node_base **)((long)_Var74._M_nxt + 0x10))) break;
                        _Var52._M_nxt = (_Var74._M_nxt)->_M_nxt;
                        if (_Var52._M_nxt == (_Hash_node_base *)0x0) {
                          pEVar51 = (Expression *)0x0;
                          break;
                        }
                        pEVar62 = (Expression *)_Var52._M_nxt[5]._M_nxt;
                        pEVar51 = (Expression *)0x0;
                        pEVar37 = (Expression *)_Var74._M_nxt;
                        _Var74._M_nxt = _Var52._M_nxt;
                        pEVar20 = pEVar62;
                      } while ((ulong)pEVar62 % uVar75 == uVar68);
                    }
                    if (pEVar51 == (Expression *)0x0) {
                      _Var52._M_nxt = (_Hash_node_base *)0x0;
                    }
                    else {
                      _Var52._M_nxt = *(_Hash_node_base **)pEVar51;
                    }
                    builder.wasm = (Module *)(ulong)IVar4;
                    if (_Var52._M_nxt == (_Hash_node_base *)0x0) {
                      _Var52._M_nxt = (_Hash_node_base *)operator_new(0x30);
                      (_Var52._M_nxt)->_M_nxt = (_Hash_node_base *)0x0;
                      p_Var88 = (_Hash_node_base *)
                                (pFVar56->super_Importable).super_Named.name.super_IString.str.
                                _M_str;
                      _Var52._M_nxt[1]._M_nxt =
                           (_Hash_node_base *)
                           (pFVar56->super_Importable).super_Named.name.super_IString.str._M_len;
                      _Var52._M_nxt[2]._M_nxt = p_Var88;
                      _Var52._M_nxt[3]._M_nxt = (_Hash_node_base *)0x0;
                      _Var52._M_nxt[4]._M_nxt = (_Hash_node_base *)0x0;
                      auVar92 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                          ((ulong)((long)&(pFVar18->splits)._M_h + 0x20),
                                           *(size_type *)((long)&(pFVar18->splits)._M_h + 8),
                                           *(size_type *)((long)&(pFVar18->splits)._M_h + 0x18));
                      __n_00 = auVar92._8_8_;
                      if ((auVar92 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        if (__n_00 == 1) {
                          __s = (__node_base_ptr *)((long)&(pFVar18->splits)._M_h + 0x30);
                          *(__node_base_ptr *)((long)&(pFVar18->splits)._M_h + 0x30) =
                               (__node_base_ptr)0x0;
                        }
                        else {
                          __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                          ((new_allocator<std::__detail::_Hash_node_base_*> *)
                                           &name.super_IString.str._M_str,__n_00,(void *)0x0);
                          memset(__s,0,__n_00 * 8);
                        }
                        _Var74._M_nxt =
                             ((__node_base *)((long)&(pFVar18->splits)._M_h + 0x10))->_M_nxt;
                        ((__node_base *)((long)&(pFVar18->splits)._M_h + 0x10))->_M_nxt =
                             (_Hash_node_base *)0x0;
                        if (_Var74._M_nxt != (_Hash_node_base *)0x0) {
                          p_Var32 = (__node_base *)((long)&(pFVar18->splits)._M_h + 0x10);
                          uVar75 = 0;
                          do {
                            p_Var88 = (_Var74._M_nxt)->_M_nxt;
                            uVar68 = (ulong)_Var74._M_nxt[5]._M_nxt % __n_00;
                            if (__s[uVar68] == (__node_base_ptr)0x0) {
                              (_Var74._M_nxt)->_M_nxt = p_Var32->_M_nxt;
                              p_Var32->_M_nxt = _Var74._M_nxt;
                              __s[uVar68] = p_Var32;
                              if ((_Var74._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                                pp_Var53 = __s + uVar75;
                                goto LAB_008ec145;
                              }
                            }
                            else {
                              (_Var74._M_nxt)->_M_nxt = __s[uVar68]->_M_nxt;
                              pp_Var53 = &__s[uVar68]->_M_nxt;
                              uVar68 = uVar75;
LAB_008ec145:
                              *pp_Var53 = _Var74._M_nxt;
                            }
                            _Var74._M_nxt = p_Var88;
                            uVar75 = uVar68;
                          } while (p_Var88 != (_Hash_node_base *)0x0);
                        }
                        pp_Var21 = (pFVar18->splits)._M_h._M_buckets;
                        if ((__node_base_ptr *)((long)&(pFVar18->splits)._M_h + 0x30U) != pp_Var21)
                        {
                          operator_delete(pp_Var21,*(size_type *)((long)&(pFVar18->splits)._M_h + 8)
                                                   << 3);
                        }
                        *(size_type *)((long)&(pFVar18->splits)._M_h + 8) = __n_00;
                        (pFVar18->splits)._M_h._M_buckets = __s;
                        uVar68 = (ulong)pEVar79 % __n_00;
                      }
                      _Var52._M_nxt[5]._M_nxt = (_Hash_node_base *)pEVar79;
                      pEVar62 = (Expression *)(pFVar18->splits)._M_h._M_buckets;
                      if (*(_Hash_node_base **)((long)&pEVar62->_id + uVar68 * 8) ==
                          (_Hash_node_base *)0x0) {
                        p_Var88 = ((__node_base *)((long)&(pFVar18->splits)._M_h + 0x10))->_M_nxt;
                        (_Var52._M_nxt)->_M_nxt = p_Var88;
                        ((__node_base *)((long)&(pFVar18->splits)._M_h + 0x10))->_M_nxt =
                             _Var52._M_nxt;
                        if (p_Var88 != (_Hash_node_base *)0x0) {
                          *(_Hash_node_base **)
                           ((long)&pEVar62->_id +
                           ((ulong)p_Var88[5]._M_nxt %
                           *(size_type *)((long)&(pFVar18->splits)._M_h + 8)) * 8) = _Var52._M_nxt;
                        }
                        pEVar62 = (Expression *)(pFVar18->splits)._M_h._M_buckets;
                        *(__node_base **)((long)&pEVar62->_id + uVar68 * 8) =
                             (__node_base *)((long)&(pFVar18->splits)._M_h + 0x10);
                      }
                      else {
                        (_Var52._M_nxt)->_M_nxt =
                             (*(_Hash_node_base **)((long)&pEVar62->_id + uVar68 * 8))->_M_nxt;
                        (*(_Hash_node_base **)((long)&pEVar62->_id + uVar68 * 8))->_M_nxt =
                             _Var52._M_nxt;
                      }
                      psVar33 = (size_type *)((long)&(pFVar18->splits)._M_h + 0x18);
                      *psVar33 = *psVar33 + 1;
                    }
                    p_Var88 = _Var52._M_nxt + 3;
                    if (p_Var88->_M_nxt == (_Hash_node_base *)0x0) {
                      __ptr_3 = (pointer)pFVar18->module;
                      if ((int)builder.wasm == 4) {
                        local_1c8._M_nxt = (_Hash_node_base *)0x6261656e696c6e69;
                        local_1c0 = 0x422d656c;
                        local_1bc = 0;
                        inlinedName.super_IString.str._M_str = (char *)&local_1c8;
                        local_60 = FunctionSplitter::copyFunction
                                             (pFVar18,pFVar56,
                                              (string *)&inlinedName.super_IString.str._M_str);
                        if ((__node_base *)inlinedName.super_IString.str._M_str != &local_1c8) {
                          operator_delete(inlinedName.super_IString.str._M_str,
                                          (ulong)((long)&(local_1c8._M_nxt)->_M_nxt + 1));
                        }
                        local_190 = (Module *)(ulong)(pFVar18->options->inlining).partialInliningIfs
                        ;
                        if (local_190 == (Module *)0x0) {
                          __assert_fail("MaxIfs > 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                        ,0x426,
                                        "Function *wasm::(anonymous namespace)::FunctionSplitter::doSplit(Function *, InliningMode)"
                                       );
                        }
                        state.actionsForFunction._M_h._M_single_bucket =
                             (__node_base_ptr)&pFVar56->type;
                        pMVar73 = (Module *)0x0;
                        do {
                          pEVar79 = ((Function *)local_60)->body;
                          if (pEVar79->_id == '\x01') {
                            pMVar72 = (Module *)pEVar79[2].type.id;
                            bVar38 = pMVar73 < pMVar72;
                            if (pMVar73 < pMVar72) {
                              pEVar62 = (Expression *)
                                        (*(_Hash_node_base **)(pEVar79 + 2))[(long)pMVar73]._M_nxt;
                              bVar38 = true;
                            }
                          }
                          else {
                            bVar38 = false;
                          }
                          if (pMVar73 != (Module *)0x0) {
                            pEVar79 = (Expression *)0x0;
                          }
                          if (bVar38) {
                            pEVar79 = pEVar62;
                          }
                          pEVar51 = (Expression *)0x0;
                          if ((pEVar79 != (Expression *)0x0) &&
                             (pEVar51 = pEVar79, pEVar79->_id != '\x02')) {
                            pEVar51 = (Expression *)0x0;
                          }
                          if (pEVar51 == (Expression *)0x0) break;
                          local_1f8._M_allocated_capacity = 0x64656e696c74756f;
                          local_1f8._8_2_ = 0x422d;
                          local_208._8_8_ = 10;
                          local_1f8._M_local_buf[10] = '\0';
                          pEVar62 = pEVar51;
                          local_208._M_allocated_capacity = (size_type)&local_1f8;
                          pFVar43 = FunctionSplitter::copyFunction
                                              (pFVar18,pFVar56,(string *)&local_208);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_208._M_allocated_capacity != &local_1f8) {
                            operator_delete((void *)local_208._M_allocated_capacity,
                                            (ulong)(local_1f8._M_allocated_capacity + 1));
                          }
                          pFVar43->body = (Expression *)pEVar51[1].type.id;
                          SVar91 = HeapType::getSignature
                                             ((HeapType *)
                                              state.actionsForFunction._M_h._M_single_bucket);
                          if (SVar91.results.id.id == 0) {
                            uVar40 = 0;
                          }
                          else {
                            uVar40 = (undefined4)
                                     CONCAT71((int7)((ulong)pFVar43->body >> 8),
                                              (pFVar43->body->type).id != 0);
                          }
                          builder.wasm._0_4_ = uVar40;
                          if ((char)uVar40 == '\0') {
                            TVar69.id = 0;
                          }
                          else {
                            SVar91 = HeapType::getSignature
                                               ((HeapType *)
                                                state.actionsForFunction._M_h._M_single_bucket);
                            TVar69 = SVar91.results.id;
                          }
                          SVar91 = HeapType::getSignature(&pFVar43->type);
                          sig.results.id = TVar69.id;
                          sig.params.id = SVar91.params.id.id;
                          HeapType::HeapType((HeapType *)&chosenActions._M_h._M_single_bucket,sig);
                          (pFVar43->type).id = (uintptr_t)chosenActions._M_h._M_single_bucket;
                          sVar26 = (pFVar43->super_Importable).super_Named.name.super_IString.str;
                          FunctionSplitter::getForwardedArgs
                                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      *)&chosenActions._M_h._M_single_bucket,
                                     (FunctionSplitter *)pFVar56,(Function *)&__ptr_3,
                                     (Builder *)pEVar62);
                          SVar91 = HeapType::getSignature(&pFVar43->type);
                          pEVar62 = (Expression *)&chosenActions._M_h._M_single_bucket;
                          pCVar55 = Builder::makeCall((Builder *)&__ptr_3,(Name)sVar26,
                                                      (
                                                  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                  *)pEVar62,SVar91.results.id,false);
                          pEVar51[1].type.id = (uintptr_t)pCVar55;
                          if (chosenActions._M_h._M_single_bucket != (__node_base_ptr)0x0) {
                            operator_delete(chosenActions._M_h._M_single_bucket,
                                            (long)local_100._M_t.
                                                  super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
                                                  .
                                                  super__Head_base<0UL,_wasm::DylinkSection_*,_false>
                                                  ._M_head_impl -
                                            (long)chosenActions._M_h._M_single_bucket);
                          }
                          if ((char)builder.wasm != '\0') {
                            uVar22 = pEVar51[1].type.id;
                            puVar54 = (undefined1 *)
                                      MixedArena::allocSpace
                                                ((MixedArena *)
                                                 ((long)&__ptr_3[10].
                                                                                                                  
                                                  super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>,_true>
                                                  .
                                                  super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>_>
                                                  ._M_storage._M_storage + 0x18),0x18,8);
                            *puVar54 = 0x13;
                            *(undefined8 *)(puVar54 + 8) = 0;
                            *(undefined8 *)(puVar54 + 0x10) = 0;
                            *(undefined8 *)(puVar54 + 8) = 1;
                            *(uintptr_t *)(puVar54 + 0x10) = uVar22;
                            pEVar51[1].type.id = (uintptr_t)puVar54;
                          }
                          pMVar73 = (Module *)
                                    ((long)&(((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                               *)&pMVar73->exports)->
                                            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                            ).replacep + 1);
                        } while (local_190 != pMVar73);
                      }
                      else {
                        if ((int)builder.wasm != 3) {
                          __assert_fail("inliningMode == InliningMode::SplitPatternB",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                        ,0x421,
                                        "Function *wasm::(anonymous namespace)::FunctionSplitter::doSplit(Function *, InliningMode)"
                                       );
                        }
                        local_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)0x6261656e696c6e69;
                        puStack_330 = (pointer)CONCAT35(puStack_330._5_3_,0x412d656c);
                        name.super_IString.str._M_str = (char *)&local_338;
                        local_60 = FunctionSplitter::copyFunction
                                             (pFVar18,pFVar56,
                                              (string *)&name.super_IString.str._M_str);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             **)name.super_IString.str._M_str != &local_338) {
                          operator_delete(name.super_IString.str._M_str,(long)local_338 + 1);
                        }
                        local_158._0_8_ = (pointer)0x64656e696c74756f;
                        local_158._8_2_ = 0x412d;
                        local_168._8_8_ = (__node_base_ptr)0xa;
                        local_158[10] = '\0';
                        local_168._0_8_ = (pointer)local_158;
                        pFVar43 = FunctionSplitter::copyFunction
                                            (pFVar18,pFVar56,(string *)local_168);
                        if ((pointer)local_168._0_8_ != (pointer)local_158) {
                          operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
                        }
                        pEVar79 = ((Function *)local_60)->body;
                        if ((pEVar79->_id == BlockId) && (pEVar79[2].type.id != 0)) {
                          pEVar79 = (Expression *)**(undefined8 **)(pEVar79 + 2);
                        }
                        if (pEVar79 == (Expression *)0x0) {
                          pEVar79 = (Expression *)0x0;
                        }
                        else if (pEVar79->_id != IfId) {
                          pEVar79 = (Expression *)0x0;
                        }
                        pEVar51 = *(Expression **)(pEVar79 + 1);
                        this_01 = (Unary *)MixedArena::allocSpace
                                                     ((MixedArena *)
                                                      ((long)&__ptr_3[10].
                                                                                                                            
                                                  super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>,_true>
                                                  .
                                                  super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>_>
                                                  ._M_storage._M_storage + 0x18),0x20,8);
                        (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).
                        super_Expression._id = UnaryId;
                        (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).
                        super_Expression.type.id = 0;
                        this_01->op = EqZInt32;
                        this_01->value = pEVar51;
                        Unary::finalize(this_01);
                        *(Unary **)(pEVar79 + 1) = this_01;
                        sVar26 = (pFVar43->super_Importable).super_Named.name.super_IString.str;
                        FunctionSplitter::getForwardedArgs
                                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)&chosenActions._M_h._M_single_bucket,
                                   (FunctionSplitter *)pFVar56,(Function *)&__ptr_3,
                                   (Builder *)pEVar62);
                        pCVar55 = Builder::makeCall((Builder *)&__ptr_3,(Name)sVar26,
                                                    (
                                                  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                  *)&chosenActions._M_h._M_single_bucket,(Type)0x0,
                                                  false);
                        pEVar79[1].type.id = (uintptr_t)pCVar55;
                        if (chosenActions._M_h._M_single_bucket != (__node_base_ptr)0x0) {
                          operator_delete(chosenActions._M_h._M_single_bucket,
                                          (long)local_100._M_t.
                                                super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>
                                                .super__Head_base<0UL,_wasm::DylinkSection_*,_false>
                                                ._M_head_impl -
                                          (long)chosenActions._M_h._M_single_bucket);
                        }
                        ((Function *)local_60)->body = pEVar79;
                        if (pFVar43->body->_id != BlockId) {
                          __assert_fail("int(_id) == int(T::SpecificId)",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                                        ,0x31b,"T *wasm::Expression::cast() [T = wasm::Block]");
                        }
                        end_it.parent = (ArenaVector<wasm::Expression_*> *)(pFVar43->body + 2);
                        start_it.index = 0;
                        start_it.parent = end_it.parent;
                        end_it.index = 1;
                        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
                                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                    *)end_it.parent,start_it,end_it);
                      }
                      p_Var88->_M_nxt = (_Hash_node_base *)local_60;
                    }
                    pFVar56 = (Function *)p_Var88->_M_nxt;
                  }
                  (pFVar81->super_Importable).super_Named.name.super_IString.str._M_str =
                       (char *)pFVar56;
                  IVar39 = this->inlinedNameHint;
                  this->inlinedNameHint = IVar39 + 1;
                  *(Index *)&(pFVar81->super_Importable).super_Named.field_0x14 = IVar39;
                  pMVar73 = local_1a0;
                  pmVar49 = std::
                            unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                            ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                                          *)auStack_148,(key_type *)local_1a0);
                  pIVar86 = (pmVar49->
                            super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                  if (pIVar86 ==
                      (pmVar49->
                      super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    this_02 = (_Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                               *)std::
                                 vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                                 ::_M_check_len(pmVar49,(size_type)pMVar73,__s_00);
                    pIVar23 = (pmVar49->
                              super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    pIVar24 = (pmVar49->
                              super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                              )._M_impl.super__Vector_impl_data._M_finish;
                    pIVar57 = std::
                              _Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                              ::_M_allocate(this_02,(size_t)pMVar73);
                    lVar63 = (long)pIVar86 - (long)pIVar23;
                    *(undefined8 *)((long)pIVar57 + lVar63 + 0x10) =
                         *(undefined8 *)&(pFVar81->super_Importable).super_Named.hasExplicitName;
                    pFVar56 = (Function *)
                              (pFVar81->super_Importable).super_Named.name.super_IString.str._M_str;
                    *(undefined8 *)((long)pIVar57 + lVar63) =
                         (Expression **)
                         (pFVar81->super_Importable).super_Named.name.super_IString.str._M_len;
                    ((undefined8 *)((long)pIVar57 + lVar63))[1] = pFVar56;
                    pIVar58 = pIVar23;
                    pIVar89 = pIVar57;
                    if (lVar63 != 0) {
                      do {
                        uVar34 = *(undefined3 *)&pIVar58->field_0x11;
                        IVar39 = pIVar58->nameHint;
                        pIVar89->insideATry = pIVar58->insideATry;
                        *(undefined3 *)&pIVar89->field_0x11 = uVar34;
                        pIVar89->nameHint = IVar39;
                        pFVar56 = pIVar58->contents;
                        pIVar89->callSite = pIVar58->callSite;
                        pIVar89->contents = pFVar56;
                        pIVar58 = pIVar58 + 1;
                        pIVar89 = pIVar89 + 1;
                      } while (pIVar58 != pIVar86);
                    }
                    for (; pIVar58 = pIVar89 + 1, pIVar24 != pIVar86; pIVar86 = pIVar86 + 1) {
                      uVar34 = *(undefined3 *)&pIVar86->field_0x11;
                      IVar39 = pIVar86->nameHint;
                      pIVar89[1].insideATry = pIVar86->insideATry;
                      *(undefined3 *)&pIVar89[1].field_0x11 = uVar34;
                      pIVar89[1].nameHint = IVar39;
                      pFVar56 = pIVar86->contents;
                      pIVar58->callSite = pIVar86->callSite;
                      pIVar89[1].contents = pFVar56;
                      pIVar89 = pIVar58;
                    }
                    if (pIVar23 != (pointer)0x0) {
                      operator_delete(pIVar23,(long)(pmVar49->
                                                                                                        
                                                  super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                                                  )._M_impl.super__Vector_impl_data.
                                                  _M_end_of_storage - (long)pIVar23);
                    }
                    (pmVar49->
                    super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                    )._M_impl.super__Vector_impl_data._M_start = pIVar57;
                    (pmVar49->
                    super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                    )._M_impl.super__Vector_impl_data._M_finish = pIVar58;
                    (pmVar49->
                    super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar57 + (long)this_02;
                  }
                  else {
                    *(undefined8 *)&pIVar86->insideATry =
                         *(undefined8 *)&(pFVar81->super_Importable).super_Named.hasExplicitName;
                    pFVar56 = (Function *)
                              (pFVar81->super_Importable).super_Named.name.super_IString.str._M_str;
                    pIVar86->callSite =
                         (Expression **)
                         (pFVar81->super_Importable).super_Named.name.super_IString.str._M_len;
                    pIVar86->contents = pFVar56;
                    ppIVar1 = &(pmVar49->
                               super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppIVar1 = *ppIVar1 + 1;
                  }
                  pmVar59 = std::__detail::
                            _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)&iterationCounts._M_h._M_single_bucket,
                                         (key_type *)auStack_1e8);
                  *pmVar59 = *pmVar59 + 1;
                  name.super_IString.str._M_str = (char *)&inlinedUses._M_h._M_single_bucket;
                  std::
                  _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<wasm::Function*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                            ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)name.super_IString.str._M_str,&stack0xfffffffffffffe60,
                             &name.super_IString.str._M_str);
                  pmVar59 = std::__detail::
                            _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)&iterationCounts._M_h._M_single_bucket,
                                         (key_type *)auStack_1e8);
                  uVar3 = *pmVar59;
                  pMVar73 = (Module *)auStack_1e8;
                  pmVar41 = std::
                            unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                            ::operator[](this_00,(key_type *)pMVar73);
                  if ((pmVar41->refs).super___atomic_base<unsigned_int>._M_i < uVar3) {
                    __assert_fail("inlinedUses[inlinedName] <= infos[inlinedName].refs",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                  ,0x555,
                                  "void wasm::(anonymous namespace)::Inlining::iteration(std::unordered_set<Function *> &)"
                                 );
                  }
                }
              }
              pFVar81 = (Function *)&(pFVar81->super_Importable).module;
            } while (pFVar81 != func_2);
          }
        }
        p_Var31 = inlinedInto._M_h._M_single_bucket;
      }
      inlinedInto._M_h._M_single_bucket = p_Var31;
      if (chosenActions._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        PassUtils::FilteredPassRunner::FilteredPassRunner
                  ((FilteredPassRunner *)&name.super_IString.str._M_str,this->module,
                   (FuncSet *)&inlinedUses._M_h._M_single_bucket,
                   &((this->super_Pass).runner)->options);
        local_2f0[0x90] = 1;
        local_168._0_8_ = operator_new(0x60);
        ((_Head_base<0UL,_wasm::Tag_*,_false> *)
        &(((pointer)(local_168._0_8_ + 8))->_M_t).
         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>)->_M_head_impl = (Tag *)0x0;
        ((_Head_base<0UL,_wasm::Tag_*,_false> *)
        &(((pointer)(local_168._0_8_ + 0x10))->_M_t).
         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>)->_M_head_impl =
             (Tag *)(local_168._0_8_ + 0x20);
        ((_Head_base<0UL,_wasm::Tag_*,_false> *)
        &(((pointer)(local_168._0_8_ + 0x18))->_M_t).
         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>)->_M_head_impl = (Tag *)0x0;
        *(undefined1 *)
         &((_Head_base<0UL,_wasm::Tag_*,_false> *)
          &(((pointer)(local_168._0_8_ + 0x20))->_M_t).
           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>)->_M_head_impl = 0;
        *(undefined1 *)
         &((_Head_base<0UL,_wasm::Tag_*,_false> *)
          &(((pointer)(local_168._0_8_ + 0x50))->_M_t).
           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>)->_M_head_impl = 0;
        ((_Head_base<0UL,_wasm::Tag_*,_false> *)
        &(((pointer)local_168._0_8_)->_M_t).
         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>)->_M_head_impl = (Tag *)&PTR__Pass_01092d60;
        ((_Head_base<0UL,_wasm::Tag_*,_false> *)
        &(((pointer)(local_168._0_8_ + 0x58))->_M_t).
         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>)->_M_head_impl = (Tag *)auStack_148;
        PassRunner::add((PassRunner *)&name.super_IString.str._M_str,
                        (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_168);
        if ((pointer)local_168._0_8_ != (pointer)0x0) {
          (**(code **)((long)*(__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                               *)local_168._0_8_ + 8))();
        }
        local_168._0_8_ = (pointer)0x0;
        pMVar73 = (Module *)&name.super_IString.str._M_str;
        if (this->optimize == true) {
          OptUtils::addUsefulPassesAfterInlining((PassRunner *)pMVar73);
        }
        PassRunner::run((PassRunner *)pMVar73);
        PassRunner::~PassRunner((PassRunner *)pMVar73);
        puStack_330 = (pointer)std::
                               _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:1389:29)>
                               ::_M_invoke;
        local_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)std::
                       _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:1389:29)>
                       ::_M_manager;
        name.super_IString.str._M_str = (char *)this;
        Module::removeFunctions(this->module,(function<bool_(wasm::Function_*)> *)pMVar73);
        if (local_338 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          pMVar73 = (Module *)&name.super_IString.str._M_str;
          (*(code *)local_338)(pMVar73,pMVar73,3);
        }
      }
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&iterationCounts._M_h._M_single_bucket);
      p_Var30 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                 *)chosenActions._M_h._M_bucket_count;
      while (p_Var30 !=
             (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
              *)0x0) {
        p_Var25 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                    **)p_Var30;
        std::__detail::
        _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
        ::_M_deallocate_node(p_Var30,(__node_ptr)pMVar73);
        p_Var30 = p_Var25;
      }
      pMVar72 = (Module *)0x0;
      memset((void *)auStack_148,0,(long)chosenActions._M_h._M_buckets << 3);
      chosenActions._M_h._M_bucket_count = 0;
      chosenActions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if ((undefined1  [8])&chosenActions._M_h._M_rehash_policy._M_next_resize != auStack_148) {
        pMVar72 = (Module *)((long)chosenActions._M_h._M_buckets << 3);
        operator_delete((void *)auStack_148,(ulong)pMVar72);
      }
      p_Var30 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                 *)state.actionsForFunction._M_h._M_bucket_count;
      if (pNStack_188 != (pointer)0x0) {
        pMVar72 = (Module *)
                  ((long)funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pNStack_188);
        operator_delete(pNStack_188,(ulong)pMVar72);
        p_Var30 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                   *)state.actionsForFunction._M_h._M_bucket_count;
      }
    }
    while (p_Var30 !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
            *)0x0) {
      p_Var25 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                  **)p_Var30;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
      ::_M_deallocate_node(p_Var30,(__node_ptr)pMVar72);
      p_Var30 = p_Var25;
    }
    memset(state.inlinableFunctions._M_h._M_single_bucket,0,
           (long)state.actionsForFunction._M_h._M_buckets << 3);
    state.actionsForFunction._M_h._M_bucket_count = 0;
    state.actionsForFunction._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    puVar47 = (undefined8 *)state.inlinableFunctions._M_h._M_bucket_count;
    if ((__node_base_ptr)&state.actionsForFunction._M_h._M_rehash_policy._M_next_resize !=
        state.inlinableFunctions._M_h._M_single_bucket) {
      operator_delete(state.inlinableFunctions._M_h._M_single_bucket,
                      (long)state.actionsForFunction._M_h._M_buckets << 3);
      puVar47 = (undefined8 *)state.inlinableFunctions._M_h._M_bucket_count;
    }
    while (puVar47 != (undefined8 *)0x0) {
      puVar87 = (undefined8 *)*puVar47;
      operator_delete(puVar47,0x28);
      puVar47 = puVar87;
    }
    memset((void *)auStack_f8,0,(long)state.inlinableFunctions._M_h._M_buckets << 3);
    state.inlinableFunctions._M_h._M_bucket_count = 0;
    state.inlinableFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((undefined1  [8])&state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize !=
        auStack_f8) {
      operator_delete((void *)auStack_f8,(long)state.inlinableFunctions._M_h._M_buckets << 3);
    }
    bVar38 = true;
    puVar47 = (undefined8 *)inlinedInto._M_h._M_bucket_count;
    if (inlinedInto._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      for (; puVar87 = (undefined8 *)inlinedInto._M_h._M_bucket_count, puVar47 != (undefined8 *)0x0;
          puVar47 = (undefined8 *)*puVar47) {
        EHUtils::handleBlockNestedPops((Function *)puVar47[1],this->module,SkipIfNoEH);
      }
      for (; puVar87 != (undefined8 *)0x0; puVar87 = (undefined8 *)*puVar87) {
        pmVar59 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_418,(key_type *)puVar87[1]);
        mVar5 = *pmVar59;
        *pmVar59 = mVar5 + 1;
        if (4 < mVar5 + 1) goto LAB_008ecce2;
      }
      pFVar18 = (this->functionSplitter)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                _M_head_impl;
      if (pFVar18 != (FunctionSplitter *)0x0) {
        auStack_148 = (undefined1  [8])0x0;
        chosenActions._M_h._M_buckets = (__buckets_ptr)0x0;
        chosenActions._M_h._M_bucket_count = 0;
        name.super_IString.str._M_str = (char *)&_Stack_318;
        local_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        puStack_330 = (pointer)0x0;
        local_328._M_allocated_capacity._0_4_ = 0x3f800000;
        local_328._8_8_ = 0;
        _Stack_318._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
        for (p_Var88 = ((__node_base *)((long)&(pFVar18->splits)._M_h + 0x10))->_M_nxt;
            p_Var88 != (_Hash_node_base *)0x0; p_Var88 = p_Var88->_M_nxt) {
          if (p_Var88[3]._M_nxt != (_Hash_node_base *)0x0) {
            auStack_f8 = (undefined1  [8])&name.super_IString.str._M_str;
            std::
            _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                      ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)auStack_f8,p_Var88[3]._M_nxt,auStack_f8);
            if (chosenActions._M_h._M_buckets == (__buckets_ptr)chosenActions._M_h._M_bucket_count)
            {
              std::vector<wasm::Name,std::allocator<wasm::Name>>::
              _M_realloc_insert<wasm::Name_const&>
                        ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_148,
                         (iterator)chosenActions._M_h._M_buckets,(Name *)(p_Var88 + 1));
            }
            else {
              uVar40 = *(undefined4 *)((long)&p_Var88[1]._M_nxt + 4);
              uVar27 = *(undefined4 *)&p_Var88[2]._M_nxt;
              uVar28 = *(undefined4 *)((long)&p_Var88[2]._M_nxt + 4);
              *(int *)chosenActions._M_h._M_buckets =
                   (int)(((Name *)(p_Var88 + 1))->super_IString).str._M_len;
              *(undefined4 *)((long)chosenActions._M_h._M_buckets + 4) = uVar40;
              *(undefined4 *)(chosenActions._M_h._M_buckets + 1) = uVar27;
              *(undefined4 *)((long)chosenActions._M_h._M_buckets + 0xc) = uVar28;
              chosenActions._M_h._M_buckets = chosenActions._M_h._M_buckets + 2;
            }
          }
        }
        state.inlinableFunctions._M_h._M_buckets = (__buckets_ptr)0x0;
        auStack_f8 = (undefined1  [8])&name.super_IString.str._M_str;
        state.inlinableFunctions._M_h._M_before_begin._M_nxt =
             (_Hash_node_base *)
             std::
             _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:995:29)>
             ::_M_invoke;
        state.inlinableFunctions._M_h._M_bucket_count =
             (size_type)
             std::
             _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:995:29)>
             ::_M_manager;
        Module::removeFunctions(pFVar18->module,(function<bool_(wasm::Function_*)> *)auStack_f8);
        if (state.inlinableFunctions._M_h._M_bucket_count != 0) {
          (*(code *)state.inlinableFunctions._M_h._M_bucket_count)(auStack_f8,auStack_f8,3);
        }
        std::
        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&name.super_IString.str._M_str);
        pp_Var36 = chosenActions._M_h._M_buckets;
        bVar38 = false;
        for (auVar61 = auStack_148; auVar61 != (undefined1  [8])pp_Var36;
            auVar61 = (undefined1  [8])
                      &(((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                          *)&((Module *)auVar61)->exports)->
                       super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                       ).stack.fixed) {
          name.super_IString.str._M_str =
               (char *)(((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                          *)&((Module *)auVar61)->exports)->
                       super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                       ).replacep;
          pmVar59 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_418,(key_type *)&name.super_IString.str._M_str);
          mVar5 = *pmVar59;
          *pmVar59 = mVar5 + 1;
          if (4 < mVar5 + 1) {
            bVar38 = true;
            break;
          }
        }
        if (auStack_148 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_148,chosenActions._M_h._M_bucket_count - (long)auStack_148
                         );
        }
        if (auVar61 != (undefined1  [8])pp_Var36) goto LAB_008ecce2;
      }
      bVar38 = false;
    }
LAB_008ecce2:
    uVar82 = (ulong)((int)uVar82 + 1);
    std::
    _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&inlinedUses._M_h._M_single_bucket);
  } while (!bVar38);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_418);
  return;
}

Assistant:

void run(Module* module_) override {
    module = module_;

    // No point to do more iterations than the number of functions, as it means
    // we are infinitely recursing (which should be very rare in practice, but
    // it is possible that a recursive call can look like it is worth inlining).
    Index iterationNumber = 0;

    auto numOriginalFunctions = module->functions.size();

    // Track in how many iterations a function was inlined into. We are willing
    // to inline many times into a function within an iteration, as e.g. that
    // helps the case of many calls of a small getter. However, if we only do
    // more inlining in separate iterations then it is likely code that was the
    // result of previous inlinings that is now being inlined into. That is, an
    // old inlining added a call to somewhere, and now we are inlining into that
    // call. This is typically recursion, which to some extent can help, but
    // then like loop unrolling it loses its benefit quickly, so set a limit
    // here.
    //
    // In addition to inlining into a function, we track how many times we do
    // other potentially repetitive operations like splitting a function before
    // inlining, as any such repetitive operation should be limited in how many
    // times we perform it. (An exception is how many times we inlined a
    // function, which we do not want to limit - it can be profitable to inline
    // a call into a great many callsites, over many iterations.)
    //
    // (Track names here, and not Function pointers, as we can remove functions
    // while inlining, and it may be confusing during debugging to have a
    // pointer to something that was removed.)
    std::unordered_map<Name, Index> iterationCounts;

    const size_t MaxIterationsForFunc = 5;

    while (iterationNumber <= numOriginalFunctions) {
#ifdef INLINING_DEBUG
      std::cout << "inlining loop iter " << iterationNumber
                << " (numFunctions: " << module->functions.size() << ")\n";
#endif
      iterationNumber++;

      std::unordered_set<Function*> inlinedInto;

      prepare();
      iteration(inlinedInto);

      if (inlinedInto.empty()) {
        return;
      }

#ifdef INLINING_DEBUG
      std::cout << "  inlined into " << inlinedInto.size() << " funcs.\n";
#endif

      for (auto* func : inlinedInto) {
        EHUtils::handleBlockNestedPops(func, *module);
      }

      for (auto* func : inlinedInto) {
        if (++iterationCounts[func->name] >= MaxIterationsForFunc) {
          return;
        }
      }

      if (functionSplitter) {
        auto splitNames = functionSplitter->finish();
        for (auto name : splitNames) {
          if (++iterationCounts[name] >= MaxIterationsForFunc) {
            return;
          }
        }
      }
    }
  }